

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O3

void amrex::average_down(MultiFab *S_fine,MultiFab *S_crse,int scomp,int ncomp,IntVect *ratio)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FabArray<amrex::FArrayBox> *this;
  bool bVar4;
  bool bVar5;
  undefined8 *puVar6;
  Periodicity *period;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  double dVar20;
  ulong local_3e8;
  ulong local_3e0;
  long local_3d8;
  int kk;
  long local_3b8;
  Array4<const_double> local_360;
  long local_320;
  FabArray<amrex::FArrayBox> *local_318;
  long local_310;
  ulong local_308;
  undefined **local_300;
  FabArrayBase *local_2f8;
  long local_2f0;
  ulong local_2e8;
  long local_2e0;
  Box local_2d4;
  Array4<const_double> local_2b8;
  MFIter mfi_1;
  BoxArray crse_S_fine_BA;
  MFIter mfi;
  
  bVar4 = FabArrayBase::is_cell_centered((FabArrayBase *)S_crse);
  BoxArray::BoxArray(&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  BoxArray::coarsen(&crse_S_fine_BA,ratio);
  bVar5 = BoxArray::operator==
                    (&crse_S_fine_BA,
                     &(S_crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  if ((bVar5) &&
     (bVar5 = DistributionMapping::operator==
                        (&(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          distributionMap,
                         &(S_crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          distributionMap), bVar5)) {
    MFIter::MFIter(&mfi,(FabArrayBase *)S_crse,true);
    if (mfi.currentIndex < mfi.endIndex) {
      local_310 = (long)scomp;
      local_320 = local_310 * 8;
      local_318 = &S_crse->super_FabArray<amrex::FArrayBox>;
      do {
        this = local_318;
        MFIter::tilebox((Box *)&local_2b8,&mfi);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>((Array4<double> *)&mfi_1,this,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_360,&S_fine->super_FabArray<amrex::FArrayBox>,&mfi);
        if (bVar4) {
          if (0 < ncomp) {
            local_2e8 = (ulong)local_2b8.jstride._4_4_;
            local_308 = (ulong)(uint)local_2b8.kstride;
            local_3e0 = 0;
            do {
              if ((int)local_2b8.jstride <= local_2b8.kstride._4_4_) {
                iVar19 = (int)local_2b8.jstride;
                do {
                  if (local_2b8.p._4_4_ <= (int)(uint)local_2b8.kstride) {
                    uVar1 = ratio->vect[0];
                    uVar2 = ratio->vect[1];
                    uVar3 = ratio->vect[2];
                    local_2e0 = (long)mfi_1.currentIndex;
                    local_2f0 = (long)mfi_1.beginIndex;
                    local_2f8 = mfi_1.fabArray;
                    local_300 = (undefined **)
                                (((long)iVar19 - (long)mfi_1.endIndex) * mfi_1.tile_size.vect._0_8_
                                 * 8 + (long)mfi_1.m_fa._M_t.
                                             super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                             _M_head_impl +
                                mfi_1._24_8_ * (local_310 + local_3e0) * 8);
                    local_3b8 = (long)local_2b8.p._4_4_;
                    do {
                      if ((int)local_2b8.p <= (int)local_2b8.jstride._4_4_) {
                        lVar10 = (long)(int)local_2b8.p;
                        iVar12 = (int)local_2b8.p * uVar1;
                        do {
                          if ((int)uVar3 < 1) {
                            dVar20 = 0.0;
                          }
                          else {
                            dVar20 = 0.0;
                            uVar15 = 0;
                            do {
                              if (0 < (int)uVar2) {
                                uVar13 = 0;
                                do {
                                  if (0 < (int)uVar1) {
                                    uVar16 = (ulong)uVar1;
                                    iVar18 = iVar12 - local_360.begin.x;
                                    do {
                                      dVar20 = dVar20 + local_360.p
                                                        [local_360.nstride * (local_310 + local_3e0)
                                                         + (int)((uVar3 * iVar19 + (int)uVar15) -
                                                                local_360.begin.z) *
                                                           local_360.kstride +
                                                           (long)(int)(((int)uVar13 +
                                                                       (int)local_3b8 * uVar2) -
                                                                      local_360.begin.y) *
                                                           CONCAT44(local_360.jstride._4_4_,
                                                                    (undefined4)local_360.jstride) +
                                                           (long)iVar18];
                                      iVar18 = iVar18 + 1;
                                      uVar16 = uVar16 - 1;
                                    } while (uVar16 != 0);
                                  }
                                  uVar13 = uVar13 + 1;
                                } while (uVar13 != uVar2);
                              }
                              uVar15 = uVar15 + 1;
                            } while (uVar15 != uVar3);
                          }
                          local_300[(local_3b8 - local_2f0) * (long)mfi_1.fabArray +
                                    (lVar10 - local_2e0)] =
                               (undefined *)(dVar20 * (1.0 / (double)(int)(uVar2 * uVar1 * uVar3)));
                          lVar10 = lVar10 + 1;
                          iVar12 = iVar12 + uVar1;
                        } while (local_2b8.jstride._4_4_ + 1 != (int)lVar10);
                      }
                      local_3b8 = local_3b8 + 1;
                    } while ((uint)local_2b8.kstride + 1 != (int)local_3b8);
                  }
                  bVar5 = iVar19 != local_2b8.kstride._4_4_;
                  iVar19 = iVar19 + 1;
                } while (bVar5);
              }
              local_3e0 = local_3e0 + 1;
            } while (local_3e0 != (uint)ncomp);
          }
        }
        else if (0 < ncomp) {
          lVar7 = (long)local_2b8.p._4_4_;
          uVar15 = 0;
          lVar10 = local_320;
          do {
            iVar19 = (int)local_2b8.jstride;
            if ((int)local_2b8.jstride <= local_2b8.kstride._4_4_) {
              do {
                if (local_2b8.p._4_4_ <= (int)(uint)local_2b8.kstride) {
                  iVar12 = ratio->vect[0];
                  iVar18 = ratio->vect[1];
                  lVar17 = CONCAT44(local_360.jstride._4_4_,(undefined4)local_360.jstride) * 8;
                  puVar6 = (undefined8 *)
                           (local_360.nstride * lVar10 + (long)(int)local_2b8.p * 8 * (long)iVar12 +
                            (lVar7 * iVar18 - (long)local_360.begin.y) * lVar17 +
                            ((long)(ratio->vect[2] * iVar19) - (long)local_360.begin.z) *
                            local_360.kstride * 8 + (long)local_360.begin.x * -8 + (long)local_360.p
                           );
                  lVar8 = mfi_1._24_8_ * lVar10 +
                          (lVar7 - mfi_1.beginIndex) * (long)mfi_1.fabArray * 8 +
                          ((long)iVar19 - (long)mfi_1.endIndex) * mfi_1.tile_size.vect._0_8_ * 8 +
                          (long)mfi_1.currentIndex * -8 +
                          (long)mfi_1.m_fa._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
                          (long)(int)local_2b8.p * 8;
                  lVar11 = lVar7;
                  do {
                    if ((int)local_2b8.p <= (int)local_2b8.jstride._4_4_) {
                      lVar14 = 0;
                      puVar9 = puVar6;
                      do {
                        *(undefined8 *)(lVar8 + lVar14 * 8) = *puVar9;
                        puVar9 = puVar9 + iVar12;
                        lVar14 = lVar14 + 1;
                      } while ((local_2b8.jstride._4_4_ - (int)local_2b8.p) + 1 != (int)lVar14);
                    }
                    lVar11 = lVar11 + 1;
                    puVar6 = (undefined8 *)((long)puVar6 + lVar17 * iVar18);
                    lVar8 = lVar8 + (long)mfi_1.fabArray * 8;
                  } while ((uint)local_2b8.kstride + 1 != (int)lVar11);
                }
                bVar5 = iVar19 != local_2b8.kstride._4_4_;
                iVar19 = iVar19 + 1;
              } while (bVar5);
            }
            uVar15 = uVar15 + 1;
            lVar10 = lVar10 + 8;
          } while (uVar15 != (uint)ncomp);
        }
        MFIter::operator++(&mfi);
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    mfi_1.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    mfi_1.fabArray = (FabArrayBase *)0x0;
    mfi_1.tile_size.vect[0] = 0;
    mfi_1.tile_size.vect[1] = 0;
    mfi_1.tile_size.vect[2] = 0;
    mfi_1.flags = '\0';
    mfi_1._29_3_ = 0;
    mfi_1.currentIndex = 0;
    mfi_1.beginIndex = 0;
    local_360.p = (double *)&PTR__FabFactory_0080b918;
    MultiFab::MultiFab((MultiFab *)&mfi,&crse_S_fine_BA,
                       &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                        distributionMap,ncomp,0,(MFInfo *)&mfi_1,
                       (FabFactory<amrex::FArrayBox> *)&local_360);
    local_318 = &S_crse->super_FabArray<amrex::FArrayBox>;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mfi_1.tile_size);
    MFIter::MFIter(&mfi_1,(FabArrayBase *)&mfi,true);
    if (mfi_1.currentIndex < mfi_1.endIndex) {
      local_310 = (long)scomp;
      local_320 = local_310 * 8;
      do {
        MFIter::tilebox(&local_2d4,&mfi_1);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_360,(FabArray<amrex::FArrayBox> *)&mfi,&mfi_1);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_2b8,&S_fine->super_FabArray<amrex::FArrayBox>,&mfi_1);
        if (bVar4) {
          if (0 < ncomp) {
            local_2e8 = (ulong)(uint)local_2d4.bigend.vect[0];
            local_308 = (ulong)(uint)local_2d4.bigend.vect[1];
            local_3e8 = 0;
            do {
              if (local_2d4.smallend.vect[2] <= local_2d4.bigend.vect[2]) {
                iVar19 = local_2d4.smallend.vect[2];
                do {
                  if (local_2d4.smallend.vect[1] <= local_2d4.bigend.vect[1]) {
                    uVar1 = ratio->vect[0];
                    uVar2 = ratio->vect[1];
                    uVar3 = ratio->vect[2];
                    local_2e0 = (long)local_360.begin.x;
                    local_2f0 = (long)local_360.begin.y;
                    local_2f8 = (FabArrayBase *)
                                CONCAT44(local_360.jstride._4_4_,(undefined4)local_360.jstride);
                    local_300 = (undefined **)
                                (local_360.p +
                                ((long)iVar19 - (long)local_360.begin.z) * local_360.kstride +
                                local_360.nstride * local_3e8);
                    local_3b8 = (long)local_2d4.smallend.vect[1];
                    do {
                      if (local_2d4.smallend.vect[0] <= local_2d4.bigend.vect[0]) {
                        lVar10 = (long)local_2d4.smallend.vect[0];
                        iVar12 = local_2d4.smallend.vect[0] * uVar1;
                        do {
                          if ((int)uVar3 < 1) {
                            dVar20 = 0.0;
                          }
                          else {
                            dVar20 = 0.0;
                            uVar15 = 0;
                            do {
                              if (0 < (int)uVar2) {
                                uVar13 = 0;
                                do {
                                  if (0 < (int)uVar1) {
                                    uVar16 = (ulong)uVar1;
                                    iVar18 = iVar12 - local_2b8.begin.x;
                                    do {
                                      dVar20 = dVar20 + *(double *)
                                                         (local_2b8.nstride *
                                                          (local_310 + local_3e8) * 8 +
                                                          CONCAT44(local_2b8.p._4_4_,
                                                                   (int)local_2b8.p) +
                                                          (long)(int)((uVar3 * iVar19 + (int)uVar15)
                                                                     - local_2b8.begin.z) *
                                                          CONCAT44(local_2b8.kstride._4_4_,
                                                                   (uint)local_2b8.kstride) * 8 +
                                                          (long)(int)(((int)uVar13 +
                                                                      (int)local_3b8 * uVar2) -
                                                                     local_2b8.begin.y) *
                                                          CONCAT44(local_2b8.jstride._4_4_,
                                                                   (int)local_2b8.jstride) * 8 +
                                                         (long)iVar18 * 8);
                                      iVar18 = iVar18 + 1;
                                      uVar16 = uVar16 - 1;
                                    } while (uVar16 != 0);
                                  }
                                  uVar13 = uVar13 + 1;
                                } while (uVar13 != uVar2);
                              }
                              uVar15 = uVar15 + 1;
                            } while (uVar15 != uVar3);
                          }
                          local_300[(local_3b8 - local_2f0) * (long)local_2f8 + (lVar10 - local_2e0)
                                   ] = (undefined *)
                                       (dVar20 * (1.0 / (double)(int)(uVar2 * uVar1 * uVar3)));
                          lVar10 = lVar10 + 1;
                          iVar12 = iVar12 + uVar1;
                        } while (local_2d4.bigend.vect[0] + 1U != (int)lVar10);
                      }
                      local_3b8 = local_3b8 + 1;
                    } while (local_2d4.bigend.vect[1] + 1U != (int)local_3b8);
                  }
                  bVar5 = iVar19 != local_2d4.bigend.vect[2];
                  iVar19 = iVar19 + 1;
                } while (bVar5);
              }
              local_3e8 = local_3e8 + 1;
            } while (local_3e8 != (uint)ncomp);
          }
        }
        else if (0 < ncomp) {
          lVar10 = (long)local_2d4.smallend.vect[1];
          _kk = 0;
          local_3d8 = local_320;
          uVar15 = 0;
          do {
            iVar19 = local_2d4.smallend.vect[2];
            if (local_2d4.smallend.vect[2] <= local_2d4.bigend.vect[2]) {
              do {
                if (local_2d4.smallend.vect[1] <= local_2d4.bigend.vect[1]) {
                  iVar12 = ratio->vect[0];
                  iVar18 = ratio->vect[1];
                  lVar8 = CONCAT44(local_2b8.jstride._4_4_,(int)local_2b8.jstride) * 8;
                  puVar6 = (undefined8 *)
                           (local_2b8.nstride * local_3d8 +
                            (long)local_2d4.smallend.vect[0] * 8 * (long)iVar12 +
                            (lVar10 * iVar18 - (long)local_2b8.begin.y) * lVar8 +
                            ((long)(ratio->vect[2] * iVar19) - (long)local_2b8.begin.z) *
                            CONCAT44(local_2b8.kstride._4_4_,(uint)local_2b8.kstride) * 8 +
                            (long)local_2b8.begin.x * -8 +
                           CONCAT44(local_2b8.p._4_4_,(int)local_2b8.p));
                  lVar11 = CONCAT44(local_360.jstride._4_4_,(undefined4)local_360.jstride) * 8;
                  lVar17 = (long)local_360.p +
                           local_360.nstride * _kk +
                           (lVar10 - local_360.begin.y) * lVar11 +
                           ((long)iVar19 - (long)local_360.begin.z) * local_360.kstride * 8 +
                           (long)local_360.begin.x * -8 + (long)local_2d4.smallend.vect[0] * 8;
                  lVar7 = lVar10;
                  do {
                    if (local_2d4.smallend.vect[0] <= local_2d4.bigend.vect[0]) {
                      lVar14 = 0;
                      puVar9 = puVar6;
                      do {
                        *(undefined8 *)(lVar17 + lVar14 * 8) = *puVar9;
                        puVar9 = puVar9 + iVar12;
                        lVar14 = lVar14 + 1;
                      } while ((local_2d4.bigend.vect[0] - local_2d4.smallend.vect[0]) + 1 !=
                               (int)lVar14);
                    }
                    lVar7 = lVar7 + 1;
                    puVar6 = (undefined8 *)((long)puVar6 + lVar8 * iVar18);
                    lVar17 = lVar17 + lVar11;
                  } while (local_2d4.bigend.vect[1] + 1U != (int)lVar7);
                }
                bVar5 = iVar19 != local_2d4.bigend.vect[2];
                iVar19 = iVar19 + 1;
              } while (bVar5);
            }
            uVar15 = uVar15 + 1;
            local_3d8 = local_3d8 + 8;
            _kk = _kk + 8;
          } while (uVar15 != (uint)ncomp);
        }
        MFIter::operator++(&mfi_1);
      } while (mfi_1.currentIndex < mfi_1.endIndex);
    }
    MFIter::~MFIter(&mfi_1);
    period = Periodicity::NonPeriodic();
    mfi_1.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
    mfi_1.fabArray = (FabArrayBase *)((ulong)mfi_1.fabArray & 0xffffffff00000000);
    local_360.p = (double *)0x0;
    local_360.jstride._0_4_ = 0;
    FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (local_318,(FabArray<amrex::FArrayBox> *)&mfi,0,scomp,ncomp,(IntVect *)&mfi_1,
               (IntVect *)&local_360,period,COPY,(CPC *)0x0,false);
    MultiFab::~MultiFab((MultiFab *)&mfi);
  }
  BoxArray::~BoxArray(&crse_S_fine_BA);
  return;
}

Assistant:

void average_down (const MultiFab& S_fine, MultiFab& S_crse,
                       int scomp, int ncomp, const IntVect& ratio)
    {
        BL_PROFILE("amrex::average_down");
        AMREX_ASSERT(S_crse.nComp() == S_fine.nComp());
        AMREX_ASSERT((S_crse.is_cell_centered() && S_fine.is_cell_centered()) ||
                     (S_crse.is_nodal()         && S_fine.is_nodal()));

        bool is_cell_centered = S_crse.is_cell_centered();

        //
        // Coarsen() the fine stuff on processors owning the fine data.
        //
        BoxArray crse_S_fine_BA = S_fine.boxArray(); crse_S_fine_BA.coarsen(ratio);

        if (crse_S_fine_BA == S_crse.boxArray() && S_fine.DistributionMap() == S_crse.DistributionMap())
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && S_crse.isFusingCandidate()) {
                auto const& crsema = S_crse.arrays();
                auto const& finema = S_fine.const_arrays();
                if (is_cell_centered) {
                    ParallelFor(S_crse, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown(i,j,k,n,crsema[box_no],finema[box_no],scomp,scomp,ratio);
                    });
                } else {
                    ParallelFor(S_crse, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown_nodes(i,j,k,n,crsema[box_no],finema[box_no],scomp,scomp,ratio);
                    });
                }
                Gpu::streamSynchronize();
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(S_crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    //  NOTE: The tilebox is defined at the coarse level.
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& crsearr = S_crse.array(mfi);
                    Array4<Real const> const& finearr = S_fine.const_array(mfi);

                    if (is_cell_centered) {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown(i,j,k,n,crsearr,finearr,scomp,scomp,ratio);
                        });
                    } else {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown_nodes(i,j,k,n,crsearr,finearr,scomp,scomp,ratio);
                        });
                    }
                }
            }
        }
        else
        {
            MultiFab crse_S_fine(crse_S_fine_BA, S_fine.DistributionMap(), ncomp, 0, MFInfo(), FArrayBoxFactory());

#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && crse_S_fine.isFusingCandidate()) {
                auto const& crsema = crse_S_fine.arrays();
                auto const& finema = S_fine.const_arrays();
                if (is_cell_centered) {
                    ParallelFor(crse_S_fine, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown(i,j,k,n,crsema[box_no],finema[box_no],0,scomp,ratio);
                    });
                } else {
                    ParallelFor(crse_S_fine, IntVect(0), ncomp,
                    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                    {
                        amrex_avgdown_nodes(i,j,k,n,crsema[box_no],finema[box_no],0,scomp,ratio);
                    });
                }
                Gpu::streamSynchronize();
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(crse_S_fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    //  NOTE: The tilebox is defined at the coarse level.
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& crsearr = crse_S_fine.array(mfi);
                    Array4<Real const> const& finearr = S_fine.const_array(mfi);

                    //  NOTE: We copy from component scomp of the fine fab into component 0 of the crse fab
                    //        because the crse fab is a temporary which was made starting at comp 0, it is
                    //        not part of the actual crse multifab which came in.

                    if (is_cell_centered) {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown(i,j,k,n,crsearr,finearr,0,scomp,ratio);
                        });
                    } else {
                        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                        {
                            amrex_avgdown_nodes(i,j,k,n,crsearr,finearr,0,scomp,ratio);
                        });
                    }
                }
            }

            S_crse.ParallelCopy(crse_S_fine,0,scomp,ncomp);
        }
   }